

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  TestCaseInfo *_testInfo;
  bool bVar1;
  uint uVar2;
  int iVar3;
  pointer pIVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  SectionTracker *pSVar6;
  byte local_26a;
  TestCaseStats local_218;
  NameAndLocation local_e8;
  SectionTracker *local_b8;
  ITracker *rootTracker;
  TestCaseInfo *local_a0;
  TestCaseInfo *testInfo;
  string redirectedCerr;
  string redirectedCout;
  Totals prevTotals;
  TestCase *testCase_local;
  RunContext *this_local;
  
  redirectedCout.field_2._8_8_ = *(undefined8 *)&this->m_totals;
  std::__cxx11::string::string((string *)(redirectedCerr.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&testInfo);
  local_a0 = TestCase::getTestCaseInfo(testCase);
  pIVar4 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->(&this->m_reporter);
  (*pIVar4->_vptr_IStreamingReporter[7])(pIVar4,local_a0);
  this->m_activeTestCase = testCase;
  local_b8 = (SectionTracker *)TestCaseTracking::TrackerContext::startRun(&this->m_trackerContext);
  uVar2 = (*(local_b8->super_TrackerBase).super_ITracker._vptr_ITracker[0xe])();
  pSVar6 = local_b8;
  if ((uVar2 & 1) != 0) {
    peVar5 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_config);
    iVar3 = (*(peVar5->super_NonCopyable)._vptr_NonCopyable[0x13])();
    TestCaseTracking::SectionTracker::addInitialFilters
              (pSVar6,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(extraout_var,iVar3));
    do {
      TestCaseTracking::TrackerContext::startCycle(&this->m_trackerContext);
      TestCaseTracking::NameAndLocation::NameAndLocation
                (&local_e8,&local_a0->name,&local_a0->lineInfo);
      pSVar6 = TestCaseTracking::SectionTracker::acquire(&this->m_trackerContext,&local_e8);
      this->m_testCaseTracker = (ITracker *)pSVar6;
      TestCaseTracking::NameAndLocation::~NameAndLocation(&local_e8);
      runCurrentTest(this,(string *)((long)&redirectedCerr.field_2 + 8),(string *)&testInfo);
      uVar2 = (*this->m_testCaseTracker->_vptr_ITracker[3])();
      local_26a = 0;
      if ((uVar2 & 1) == 0) {
        bVar1 = aborting(this);
        local_26a = bVar1 ^ 0xff;
      }
    } while ((local_26a & 1) != 0);
    Totals::delta(__return_storage_ptr__,&this->m_totals,
                  (Totals *)((long)&redirectedCout.field_2 + 8));
    bVar1 = TestCaseInfo::expectedToFail(local_a0);
    if ((bVar1) && ((__return_storage_ptr__->testCases).passed != 0)) {
      (__return_storage_ptr__->assertions).failed = (__return_storage_ptr__->assertions).failed + 1;
      (__return_storage_ptr__->testCases).passed = (__return_storage_ptr__->testCases).passed - 1;
      (__return_storage_ptr__->testCases).failed = (__return_storage_ptr__->testCases).failed + 1;
    }
    Counts::operator+=(&(this->m_totals).testCases,&__return_storage_ptr__->testCases);
    pIVar4 = clara::std::
             unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
             ::operator->(&this->m_reporter);
    _testInfo = local_a0;
    bVar1 = aborting(this);
    TestCaseStats::TestCaseStats
              (&local_218,_testInfo,__return_storage_ptr__,
               (string *)((long)&redirectedCerr.field_2 + 8),(string *)&testInfo,bVar1);
    (*pIVar4->_vptr_IStreamingReporter[0x10])(pIVar4,&local_218);
    TestCaseStats::~TestCaseStats(&local_218);
    this->m_activeTestCase = (TestCase *)0x0;
    this->m_testCaseTracker = (ITracker *)0x0;
    std::__cxx11::string::~string((string *)&testInfo);
    std::__cxx11::string::~string((string *)(redirectedCerr.field_2._M_local_buf + 8));
    return __return_storage_ptr__;
  }
  __assert_fail("rootTracker.isSectionTracker()",
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/catch2/catch.hpp"
                ,0x31d4,"Totals Catch::RunContext::runTest(const TestCase &)");
}

Assistant:

Totals RunContext::runTest(TestCase const& testCase) {
        Totals prevTotals = m_totals;

        std::string redirectedCout;
        std::string redirectedCerr;

        auto const& testInfo = testCase.getTestCaseInfo();

        m_reporter->testCaseStarting(testInfo);

        m_activeTestCase = &testCase;

        ITracker& rootTracker = m_trackerContext.startRun();
        assert(rootTracker.isSectionTracker());
        static_cast<SectionTracker&>(rootTracker).addInitialFilters(m_config->getSectionsToRun());
        do {
            m_trackerContext.startCycle();
            m_testCaseTracker = &SectionTracker::acquire(m_trackerContext, TestCaseTracking::NameAndLocation(testInfo.name, testInfo.lineInfo));
            runCurrentTest(redirectedCout, redirectedCerr);
        } while (!m_testCaseTracker->isSuccessfullyCompleted() && !aborting());

        Totals deltaTotals = m_totals.delta(prevTotals);
        if (testInfo.expectedToFail() && deltaTotals.testCases.passed > 0) {
            deltaTotals.assertions.failed++;
            deltaTotals.testCases.passed--;
            deltaTotals.testCases.failed++;
        }
        m_totals.testCases += deltaTotals.testCases;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
                                  deltaTotals,
                                  redirectedCout,
                                  redirectedCerr,
                                  aborting()));

        m_activeTestCase = nullptr;
        m_testCaseTracker = nullptr;

        return deltaTotals;
    }